

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_SLT(Context *ctx)

{
  uint uVar1;
  size_t in_RCX;
  char src0 [64];
  char src1 [64];
  char code [128];
  
  uVar1 = vecsize_from_writemask((ctx->dest_arg).writemask);
  make_METAL_srcarg_string_masked(ctx,0,src0,in_RCX);
  make_METAL_srcarg_string_masked(ctx,1,src1,in_RCX);
  if (uVar1 == 1) {
    make_METAL_destarg_assign(ctx,code,0x80,"float(%s < %s)",src0,src1);
  }
  else {
    make_METAL_destarg_assign(ctx,code,0x80,"float%d(%s < %s)",(ulong)uVar1,src0,src1);
  }
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_SLT(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // float(bool) or vec(bvec) results in 0.0 or 1.0, like SLT wants.
    if (vecsize == 1)
        make_METAL_destarg_assign(ctx, code, sizeof (code), "float(%s < %s)", src0, src1);
    else
    {
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                  "float%d(%s < %s)", vecsize, src0, src1);
    } // else
    output_line(ctx, "%s", code);
}